

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.c
# Opt level: O2

nh_msgtype_rules * parse_msgtype_rules(char *str)

{
  char *pcVar1;
  char *pcVar2;
  size_t sVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  undefined8 local_c0;
  char pattern [121];
  
  if (str == (char *)0x0) {
    return (nh_msgtype_rules *)0x0;
  }
  if (*str != '\0') {
    lVar5 = 0;
    pcVar1 = str;
    while (pcVar1 = strchr(pcVar1,0x3b), pcVar1 != (char *)0x0) {
      pcVar1 = pcVar1 + 1;
      lVar5 = lVar5 + 1;
    }
    if ((int)lVar5 != 0) {
      mt_rules_static.rules = mt_rules_array;
      mt_rules_static.num_rules = (int)lVar5;
      pcVar1 = strdup(str);
      lVar4 = 0;
      local_c0 = pcVar1;
      while ((bVar6 = lVar5 != 0, lVar5 = lVar5 + -1, bVar6 &&
             (pcVar2 = strchr(pcVar1,0x3b), pcVar2 != (char *)0x0))) {
        *pcVar2 = '\0';
        __isoc99_sscanf(pcVar1,"(\"%120[^|]|%u)",pattern,
                        (mt_rules_static.rules)->pattern + lVar4 + 0x78);
        sVar3 = strlen(pattern);
        pattern[sVar3 - 1] = '\0';
        strcpy((mt_rules_static.rules)->pattern + lVar4,pattern);
        pcVar1 = pcVar2 + 1;
        lVar4 = lVar4 + 0x7c;
      }
      free(local_c0);
      return &mt_rules_static;
    }
  }
  return (nh_msgtype_rules *)0x0;
}

Assistant:

struct nh_msgtype_rules *parse_msgtype_rules(const char *str)
{
    struct nh_msgtype_rules *out;
    char *semi, *copy;
    const char *start;
    int i, rcount;

    if (!str || !*str)
	return NULL;

    /* Count number of rules based on number of semicolons. */
    rcount = 0;
    start = str;
    while ((semi = strchr(start, ';'))) {
	rcount++;
	start = semi + 1;
    }
    if (rcount == 0)
	return NULL;

    out = &mt_rules_static;
    out->num_rules = rcount;
    out->rules = mt_rules_array;

    /* Parse the rules. */
    copy = strdup(str);
    start = copy;
    for (i = 0; i < rcount && (semi = strchr(start, ';')); i++) {
	/* Big enough for the pattern, extra " and null terminator. */
	char pattern[121];

	*semi = '\0';
	sscanf(start, "(\"%120[^|]|%u)", pattern, &out->rules[i].action);
	/* Remove extra " at the end of the %[ match. */
	pattern[strlen(pattern) - 1] = '\0';
	strcpy(out->rules[i].pattern, pattern);

	start = semi + 1;
    }
    free(copy);

    return out;
}